

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

char * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::SnailAllocPages<false>
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this,uint pageCount,PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment)

{
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *this_00;
  RealCount *pRVar1;
  size_t *psVar2;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *pDVar3;
  DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *pDVar4;
  code *pcVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined4 *puVar9;
  PageSegmentBase<Memory::VirtualAllocWrapper> *this_01;
  PageSegmentBase<Memory::VirtualAllocWrapper> *pPVar10;
  char *pcVar11;
  DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *this_02;
  ulong uVar12;
  undefined1 local_48 [8];
  EditingIterator iter;
  
  iVar7 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar7 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x577,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar6) goto LAB_0070f770;
    *puVar9 = 0;
  }
  this_00 = &this->emptySegments;
  if ((DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
      (this->emptySegments).
      super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>.next.base !=
      this_00) {
    this_01 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Head
                        (this_00);
    uVar12 = (ulong)pageCount * 0x1000 - 1;
    pDVar3 = iter.super_Iterator.list;
    if (((ulong)(this_01->super_SegmentBase<Memory::VirtualAllocWrapper>).address & uVar12) != 0) {
      local_48 = (undefined1  [8])this_00;
      iter.super_Iterator.list = this_00;
      iter.super_Iterator.current = (NodeBase *)pageSegment;
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      this_01 = (PageSegmentBase<Memory::VirtualAllocWrapper> *)0x0;
      do {
        if (iter.super_Iterator.list ==
            (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                             ,0x66,"(current != nullptr)","current != nullptr");
          if (!bVar6) goto LAB_0070f770;
          *puVar9 = 0;
        }
        iter.super_Iterator.list =
             ((iter.super_Iterator.list)->
             super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.list;
        pageSegment = (PageSegmentBase<Memory::VirtualAllocWrapper> **)iter.super_Iterator.current;
        pDVar3 = (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0;
        if ((undefined1  [8])iter.super_Iterator.list == local_48) break;
        pPVar10 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::
                  Iterator::Data((Iterator *)local_48);
        pcVar11 = (pPVar10->super_SegmentBase<Memory::VirtualAllocWrapper>).address;
        if ((uVar12 & (ulong)pcVar11) == 0) {
          pDVar3 = ((iter.super_Iterator.list)->
                   super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).prev.
                   list;
          (pDVar3->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next
               = ((iter.super_Iterator.list)->
                 super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next;
          (((iter.super_Iterator.list)->
           super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.base)->
          prev = ((iter.super_Iterator.list)->
                 super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).prev;
          pDVar4 = (this->emptySegments).
                   super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>.next.
                   base;
          ((iter.super_Iterator.list)->
          super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).prev =
               pDVar4->prev;
          ((iter.super_Iterator.list)->
          super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.base =
               pDVar4;
          (((pDVar4->prev).base)->next).list = iter.super_Iterator.list;
          (pDVar4->prev).list = iter.super_Iterator.list;
          ((RealCount *)((long)local_48 + 0x10))->count =
               ((RealCount *)((long)local_48 + 0x10))->count - 1;
          pRVar1 = &(this->emptySegments).super_RealCount;
          pRVar1->count = pRVar1->count + 1;
          this_01 = pPVar10;
          iter.super_Iterator.list = pDVar3;
        }
        pageSegment = (PageSegmentBase<Memory::VirtualAllocWrapper> **)iter.super_Iterator.current;
        pDVar3 = iter.super_Iterator.list;
      } while ((uVar12 & (ulong)pcVar11) != 0);
    }
    iter.super_Iterator.list = pDVar3;
    if ((this_01 != (PageSegmentBase<Memory::VirtualAllocWrapper> *)0x0) &&
       (pcVar11 = PageSegmentBase<Memory::VirtualAllocWrapper>::AllocPages<false>(this_01,pageCount)
       , pcVar11 != (char *)0x0)) goto LAB_0070f745;
  }
  pcVar11 = TryAllocDecommittedPages<false>(this,pageCount,pageSegment);
  if (pcVar11 != (char *)0x0) {
    FillAllocPages(this,pcVar11,pageCount);
    return pcVar11;
  }
  if (this->maxAllocPageCount < pageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x5a9,"(maxAllocPageCount >= pageCount)","maxAllocPageCount >= pageCount");
    if (!bVar6) {
LAB_0070f770:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar9 = 0;
  }
  uVar8 = this->maxAllocPageCount - pageCount;
  if ((uVar8 != 0) && ((ulong)this->maxFreePageCount < (ulong)uVar8 + this->freePageCount)) {
    this_02 = (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
              AllocPageSegment(&this->decommitSegments,this,false,false,this->enableWriteBarrier);
    if (this_02 == (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)0x0) {
      return (char *)0x0;
    }
    pcVar11 = PageSegmentBase<Memory::VirtualAllocWrapper>::
              AllocDecommitPages<BVStatic<272ul>,false>
                        ((PageSegmentBase<Memory::VirtualAllocWrapper> *)this_02,pageCount,
                         (BVStatic<272UL>)
                         *(Type (*) [5])
                          &(this_02->data).super_SegmentBase<Memory::VirtualAllocWrapper>.
                           trailingGuardPageCount,
                         (BVStatic<272UL>)*(Type (*) [5])&(this_02->data).freePages.data[3].word);
    if (pcVar11 == (char *)0x0) {
      return (char *)0x0;
    }
    this->decommitPageCount =
         this->decommitPageCount +
         (ulong)*(uint *)((long)&(this_02->data).decommitPages.data[3].word + 4);
    iter.super_Iterator.current = (NodeBase *)pageSegment;
    FillAllocPages(this,pcVar11,pageCount);
    uVar12 = (ulong)pageCount;
    LogRecommitPages(this,uVar12);
    this->usedBytes = this->usedBytes + uVar12 * 0x1000;
    LOCK();
    totalUsedBytes = totalUsedBytes + uVar12 * 0x1000;
    UNLOCK();
    if (maxUsedBytes < totalUsedBytes) {
      maxUsedBytes = totalUsedBytes;
    }
    if (this->memoryData != (PageMemoryData *)0x0) {
      psVar2 = &this->memoryData->allocPageCount;
      *psVar2 = *psVar2 + uVar12;
    }
    ((iter.super_Iterator.current)->next).node = this_02;
    return pcVar11;
  }
  this_01 = AddPageSegment(this,this_00);
  if (this_01 == (PageSegmentBase<Memory::VirtualAllocWrapper> *)0x0) {
    return (char *)0x0;
  }
  pcVar11 = PageSegmentBase<Memory::VirtualAllocWrapper>::AllocPages<false>(this_01,pageCount);
  if (pcVar11 == (char *)0x0) {
    return (char *)0x0;
  }
LAB_0070f745:
  OnAllocFromNewSegment
            (this,pageCount,pcVar11,&this_01->super_SegmentBase<Memory::VirtualAllocWrapper>);
  (((NodeBase *)pageSegment)->next).base =
       (DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)this_01;
  return pcVar11;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::SnailAllocPages(uint pageCount, TPageSegment ** pageSegment)
{
    Assert(!this->HasMultiThreadAccess());

    char * pages = nullptr;
    TPageSegment * newSegment = nullptr;

    if (!emptySegments.Empty())
    {
        newSegment = &emptySegments.Head();

        if (!notPageAligned && !TPageSegment::IsAllocationPageAligned(newSegment->GetAddress(), pageCount))
        {
            newSegment = nullptr;

            // Scan through the empty segments for a segment that can fit this allocation
            FOREACH_DLISTBASE_ENTRY_EDITING(TPageSegment, emptySegment, &this->emptySegments, iter)
            {
                if (TPageSegment::IsAllocationPageAligned(emptySegment.GetAddress(), pageCount))
                {
                    iter.MoveCurrentTo(&this->emptySegments);
                    newSegment = &emptySegment;
                    break;
                }
            }
            NEXT_DLISTBASE_ENTRY_EDITING
        }

        if (newSegment != nullptr)
        {
            pages = newSegment->template AllocPages<notPageAligned>(pageCount);
            if (pages != nullptr)
            {
                OnAllocFromNewSegment(pageCount, pages, newSegment);
                *pageSegment = newSegment;
                return pages;
            }
        }
    }

    pages = TryAllocDecommittedPages<notPageAligned>(pageCount, pageSegment);
    if (pages != nullptr)
    {
        // TryAllocDecommittedPages may give out a mix of free pages and decommitted pages.
        // Free pages are filled with 0xFE in debug build, so we need to zero them
        // out before giving it out. In release build, free page is already zeroed
        // in ReleasePages
        this->FillAllocPages(pages, pageCount);
        return pages;
    }

    Assert(pages == nullptr);
    Assert(maxAllocPageCount >= pageCount);
    if (maxAllocPageCount != pageCount && (maxFreePageCount < maxAllocPageCount - pageCount + freePageCount))
    {
        // If we exceed the number of max free page count, allocate from a new fully decommit block
        TPageSegment * decommitSegment = AllocPageSegment(
            this->decommitSegments, this, false, false, this->enableWriteBarrier);
        if (decommitSegment == nullptr)
        {
            return nullptr;
        }

        pages = decommitSegment->template DoAllocDecommitPages<notPageAligned>(pageCount);
        if (pages != nullptr)
        {
#if DBG_DUMP
            this->decommitPageCount = this->decommitPageCount + decommitSegment->GetDecommitPageCount();
#endif
            this->FillAllocPages(pages, pageCount);

            LogRecommitPages(pageCount);
            LogAllocPages(pageCount);

            *pageSegment = decommitSegment;
        }
        return pages;
    }

    // At this point, we haven't been able to allocate either from the
    // decommitted pages, or from the empty segment list, so we'll
    // try allocating a segment. In a page allocator with a pre-reserved segment,
    // we're not allowed to allocate additional segments so return here.
    // Otherwise, add a new segment and allocate from it

    newSegment = AddPageSegment(emptySegments);
    if (newSegment == nullptr)
    {
        return nullptr;
    }

    pages = newSegment->template AllocPages<notPageAligned>(pageCount);
    if (notPageAligned)
    {
        // REVIEW: Is this true for single-chunk allocations too? Are new segments guaranteed to
        // allow for single-chunk allocations to succeed?
        Assert(pages != nullptr);
    }

    if (pages != nullptr)
    {
        OnAllocFromNewSegment(pageCount, pages, newSegment);
        *pageSegment = newSegment;
    }

    return pages;
}